

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *postOrderPartial,float *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          float *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  float fVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int j;
  float sumOverEndState;
  int k;
  float denominator;
  float numerator;
  int v;
  int patternIndex;
  int w;
  int pattern;
  float weight;
  int category;
  float *firstDerivMatrix;
  double *categoryRates_local;
  int secondDerivativeIndex_local;
  int firstDerivativeIndex_local;
  float *preOrderPartial_local;
  float *postOrderPartial_local;
  BeagleCPUImpl<float,_1,_0> *this_local;
  
  pfVar2 = this->gTransitionMatrices[firstDerivativeIndex];
  for (category = 0; category < this->kCategoryCount; category = category + 1) {
    fVar1 = categoryWeights[category];
    for (pattern = 0; pattern < this->kPatternCount; pattern = pattern + 1) {
      w = category * this->kMatrixSize;
      iVar4 = (category * this->kPatternCount + pattern) * this->kPartialsPaddedStateCount;
      numerator = 0.0;
      denominator = 0.0;
      for (k = 0; k < this->kStateCount; k = k + 1) {
        sumOverEndState = 0.0;
        for (j = 0; j < this->kStateCount; j = j + 1) {
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)postOrderPartial[iVar4 + j]),
                                   ZEXT416((uint)pfVar2[w]),ZEXT416((uint)sumOverEndState));
          sumOverEndState = auVar3._0_4_;
          w = w + 1;
        }
        w = w + 1;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)preOrderPartial[iVar4 + k]),
                                 ZEXT416((uint)sumOverEndState),ZEXT416((uint)numerator));
        numerator = auVar3._0_4_;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)preOrderPartial[iVar4 + k]),
                                 ZEXT416((uint)postOrderPartial[iVar4 + k]),
                                 ZEXT416((uint)denominator));
        denominator = auVar3._0_4_;
      }
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)numerator),ZEXT416((uint)fVar1),
                               ZEXT416((uint)this->grandNumeratorDerivTmp[pattern]));
      this->grandNumeratorDerivTmp[pattern] = auVar3._0_4_;
      auVar3 = vfmadd213ss_fma(ZEXT416((uint)denominator),ZEXT416((uint)fVar1),
                               ZEXT416((uint)this->grandDenominatorDerivTmp[pattern]));
      this->grandDenominatorDerivTmp[pattern] = auVar3._0_4_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                       const REALTYPE *preOrderPartial,
                                                                       const int firstDerivativeIndex,
                                                                       const int secondDerivativeIndex,
                                                                       const double *categoryRates,
                                                                       const REALTYPE *categoryWeights,
                                                                       const int scalingFactorsIndex,
//                                                                       const REALTYPE *cumulativeScaleBuffer,
                                                                       double *outDerivatives,
                                                                       double *outSumDerivatives,
                                                                       double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {
        const REALTYPE weight = categoryWeights[category];

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            int w = category * kMatrixSize;

            const int patternIndex = category * kPatternCount + pattern;
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE numerator = 0.0;
            REALTYPE denominator = 0.0;

            for (int k = 0; k < kStateCount; k++) {

                REALTYPE sumOverEndState = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sumOverEndState += firstDerivMatrix[w]
                                       * postOrderPartial[v + j]; // fix padded index
                    w++;
                }
                w += T_PAD;

                numerator += sumOverEndState * preOrderPartial[v + k];
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }

            grandNumeratorDerivTmp[pattern] += weight * numerator;
            grandDenominatorDerivTmp[pattern] += weight * denominator;
        }
    }
}